

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSphereSphereCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
cbtSphereSphereCollisionAlgorithm::cbtSphereSphereCollisionAlgorithm
          (cbtSphereSphereCollisionAlgorithm *this,cbtPersistentManifold *mf,
          cbtCollisionAlgorithmConstructionInfo *ci,cbtCollisionObjectWrapper *col0Wrap,
          cbtCollisionObjectWrapper *col1Wrap)

{
  cbtDispatcher *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  
  cbtActivatingCollisionAlgorithm::cbtActivatingCollisionAlgorithm
            (&this->super_cbtActivatingCollisionAlgorithm,ci,col0Wrap,col1Wrap);
  (this->super_cbtActivatingCollisionAlgorithm).super_cbtCollisionAlgorithm.
  _vptr_cbtCollisionAlgorithm = (_func_int **)&PTR__cbtSphereSphereCollisionAlgorithm_01193bb0;
  this->m_ownManifold = false;
  this->m_manifoldPtr = mf;
  if (mf == (cbtPersistentManifold *)0x0) {
    pcVar1 = (this->super_cbtActivatingCollisionAlgorithm).super_cbtCollisionAlgorithm.m_dispatcher;
    iVar2 = (*pcVar1->_vptr_cbtDispatcher[3])
                      (pcVar1,col0Wrap->m_collisionObject,col1Wrap->m_collisionObject);
    this->m_manifoldPtr = (cbtPersistentManifold *)CONCAT44(extraout_var,iVar2);
    this->m_ownManifold = true;
  }
  return;
}

Assistant:

cbtSphereSphereCollisionAlgorithm::cbtSphereSphereCollisionAlgorithm(cbtPersistentManifold* mf, const cbtCollisionAlgorithmConstructionInfo& ci, const cbtCollisionObjectWrapper* col0Wrap, const cbtCollisionObjectWrapper* col1Wrap)
	: cbtActivatingCollisionAlgorithm(ci, col0Wrap, col1Wrap),
	  m_ownManifold(false),
	  m_manifoldPtr(mf)
{
	if (!m_manifoldPtr)
	{
		m_manifoldPtr = m_dispatcher->getNewManifold(col0Wrap->getCollisionObject(), col1Wrap->getCollisionObject());
		m_ownManifold = true;
	}
}